

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

void __thiscall wasm::I64ToI32Lowering::visitGlobalSet(I64ToI32Lowering *this,GlobalSet *curr)

{
  bool bVar1;
  size_type sVar2;
  Expression *pEVar3;
  GlobalSet *this_00;
  Block *expression;
  ulong in_RCX;
  char *extraout_RDX;
  Name NVar4;
  optional<wasm::Type> type;
  undefined1 local_68 [8];
  TempVar highBits;
  size_t local_40;
  char *local_38;
  
  sVar2 = std::
          _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&(this->originallyI64Globals)._M_h,&curr->name);
  if (sVar2 != 0) {
    bVar1 = handleUnreachable(this,(Expression *)curr);
    if (!bVar1) {
      fetchOutParam((TempVar *)local_68,this,curr->value);
      highBits.ty.id =
           (uintptr_t)
           (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      NVar4.super_IString.str._M_str = extraout_RDX;
      NVar4.super_IString.str._M_len = (size_t)(curr->name).super_IString.str._M_str;
      NVar4 = makeHighName((wasm *)(curr->name).super_IString.str._M_len,NVar4);
      if ((char)highBits.pass == '\x01') {
        __assert_fail("!moved",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
      }
      pEVar3 = (Expression *)
               MixedArena::allocSpace
                         (&((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                           allocator,0x18,8);
      pEVar3->_id = LocalGetId;
      *(undefined4 *)(pEVar3 + 1) = local_68._0_4_;
      (pEVar3->type).id = 2;
      this_00 = (GlobalSet *)
                MixedArena::allocSpace((MixedArena *)(*(long *)highBits.ty.id + 0x200),0x28,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (this_00->name).super_IString.str._M_len = 0;
      local_40 = NVar4.super_IString.str._M_len;
      (this_00->name).super_IString.str._M_len = local_40;
      local_38 = NVar4.super_IString.str._M_str;
      (this_00->name).super_IString.str._M_str = local_38;
      this_00->value = pEVar3;
      GlobalSet::finalize(this_00);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
      expression = Builder::makeSequence
                             ((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                              (Expression *)curr,(Expression *)this_00,type);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)expression);
      TempVar::~TempVar((TempVar *)local_68);
    }
  }
  return;
}

Assistant:

void visitGlobalSet(GlobalSet* curr) {
    if (!originallyI64Globals.count(curr->name)) {
      return;
    }
    if (handleUnreachable(curr)) {
      return;
    }
    TempVar highBits = fetchOutParam(curr->value);
    auto* setHigh = builder->makeGlobalSet(
      makeHighName(curr->name), builder->makeLocalGet(highBits, Type::i32));
    replaceCurrent(builder->makeSequence(curr, setHigh));
  }